

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

double solver2_progress(sat_solver2 *s)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double F;
  double progress;
  int i;
  sat_solver2 *s_local;
  
  F = 0.0;
  iVar1 = s->size;
  for (progress._4_4_ = 0; progress._4_4_ < s->size; progress._4_4_ = progress._4_4_ + 1) {
    iVar2 = var_value(s,progress._4_4_);
    if (iVar2 != 3) {
      iVar2 = var_level(s,progress._4_4_);
      dVar3 = pow(1.0 / (double)iVar1,(double)iVar2);
      F = dVar3 + F;
    }
  }
  return F / (double)s->size;
}

Assistant:

static double solver2_progress(sat_solver2* s)
{
    int i;
    double progress = 0.0, F = 1.0 / s->size;
    for (i = 0; i < s->size; i++)
        if (var_value(s, i) != varX)
            progress += pow(F, var_level(s, i));
    return progress / s->size;
}